

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool duckdb_je_arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  arena_t *arena;
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  szind_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t usize_max;
  rtree_t *rtree;
  ulong uVar8;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  sVar7 = extra;
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,sVar7);
  _Var3 = true;
  if (0x7000000000000000 < size) goto LAB_01f87541;
  if (size < 0x1001) {
    sVar7 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar8 = size * 2 - 1;
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar8 = -1L << (0x3c - ((byte)lVar1 ^ 0x3f) & 0x3f);
    sVar7 = ~uVar8 + size & uVar8;
  }
  uVar8 = extra + size;
  if (uVar8 < 0x1001) {
    usize_max = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar8 + 7 >> 3]];
  }
  else if (uVar8 < 0x7000000000000001) {
    uVar6 = uVar8 * 2 - 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar6 = -1L << (0x3c - ((byte)lVar1 ^ 0x3f) & 0x3f);
    usize_max = ~uVar6 + uVar8 & uVar6;
  }
  else {
    usize_max = 0;
  }
  if ((0x3800 < oldsize) || (0x3800 < sVar7)) {
    if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
      _Var3 = duckdb_je_large_ralloc_no_move(tsdn,local_1c8.edata,sVar7,usize_max,zero);
    }
    goto LAB_01f87541;
  }
  if (usize_max < 0x3801) {
    if (usize_max < 0x1001) {
      sVar4 = (szind_t)duckdb_je_sz_size2index_tab[usize_max + 7 >> 3];
    }
    else {
      sVar4 = sz_size2index_compute(usize_max);
    }
    if (oldsize < 0x1001) {
      uVar5 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar5 = sz_size2index_compute(oldsize);
    }
    if (sVar4 != uVar5) goto LAB_01f874ed;
  }
  else {
LAB_01f874ed:
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_01f87541;
  }
  arena = (arena_t *)duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr;
  if (tsdn == (tsdn_t *)0x0) {
    _Var3 = false;
  }
  else {
    _Var2 = ticker_geom_ticks(&(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                              ,&(tsdn->tsd).
                                cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                              (uint)('\0' < (tsdn->tsd).
                                            cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                    ),false);
    _Var3 = false;
    if (_Var2) {
      duckdb_je_arena_decay(tsdn,arena,false,false);
    }
  }
LAB_01f87541:
  *newsize = *(size_t *)
              ((long)duckdb_je_sz_index2size_tab +
              (ulong)((uint)(local_1c8.edata)->e_bits >> 0x11 & 0x7f8));
  return _Var3;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_t *arena = arena_get_from_edata(edata);
		arena_decay_tick(tsdn, arena);
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, edata, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(edata == emap_edata_lookup(tsdn, &arena_emap_global, ptr));
	*newsize = edata_usize_get(edata);

	return ret;
}